

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.cpp
# Opt level: O2

void __thiscall merlin::cte::update(cte *this)

{
  pointer pnVar1;
  int iVar2;
  pointer pnVar3;
  edge *peVar4;
  pointer piVar5;
  size_t sVar6;
  long lVar7;
  size_t i;
  ulong uVar8;
  pointer ppeVar9;
  factor *this_00;
  value __x;
  double dVar10;
  variable VX;
  variable local_d8;
  variable_set local_c8;
  factor local_90;
  
  for (uVar8 = 0;
      pnVar3 = (this->m_clusters).
               super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)(((long)(this->m_clusters).
                             super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar3) / 0x158);
      uVar8 = uVar8 + 1) {
    pnVar1 = pnVar3 + uVar8;
    this_00 = &pnVar3[uVar8].belief;
    factor::operator=(this_00,&pnVar3[uVar8].theta);
    for (ppeVar9 = pnVar3[uVar8].edges.
                   super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppeVar9 !=
        *(pointer *)
         ((long)&(pnVar1->edges).
                 super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>
                 ._M_impl + 8); ppeVar9 = ppeVar9 + 1) {
      peVar4 = *ppeVar9;
      sVar6 = pnVar1->id;
      if (peVar4->second->id == sVar6) {
        factor::binaryOpIP<merlin::factor::binOpTimes>(this_00,&peVar4->fwd);
        sVar6 = pnVar1->id;
      }
      if (peVar4->first->id == sVar6) {
        factor::binaryOpIP<merlin::factor::binOpTimes>(this_00,&peVar4->bwd);
      }
    }
  }
  __x = factor::sum(&this->m_root->belief);
  dVar10 = ::log(__x);
  this->m_logz = dVar10;
  lVar7 = 0;
  for (uVar8 = 0;
      piVar5 = (this->m_var2clique).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(this->m_var2clique).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2);
      uVar8 = uVar8 + 1) {
    iVar2 = piVar5[uVar8];
    dVar10 = (this->m_gmo).m_dims.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8];
    local_d8.m_states = (size_t)dVar10;
    pnVar3 = (this->m_clusters).
             super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>._M_impl
             .super__Vector_impl_data._M_start;
    local_d8.m_states =
         (long)(dVar10 - 9.223372036854776e+18) & (long)local_d8.m_states >> 0x3f |
         local_d8.m_states;
    local_d8.m_label = uVar8;
    variable_set::variable_set(&local_c8,&local_d8);
    factor::marginal(&local_90,&pnVar3[iVar2].belief,&local_c8);
    factor::operator=((factor *)
                      ((long)&((this->m_beliefs).
                               super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                               _M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar7),
                      &local_90);
    factor::~factor(&local_90);
    variable_set::~variable_set(&local_c8);
    factor::normalize((factor *)
                      ((long)&((this->m_beliefs).
                               super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                               _M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar7));
    lVar7 = lVar7 + 0x60;
  }
  return;
}

Assistant:

void cte::update() {

	// Compute the clique beliefs
	for (size_t i = 0; i < m_clusters.size(); ++i) {
		detail::node& cl = m_clusters[i];
		cl.belief = cl.theta;
		for (std::vector<detail::edge*>::iterator ei = cl.edges.begin();
				ei != cl.edges.end(); ++ei) {
			detail::edge* e = (*ei);
			if (e->second->id == cl.id) {
				cl.belief *= e->fwd;
			}
			if (e->first->id == cl.id) {
				cl.belief *= e->bwd;
			}
		}
	}

	// Compute the log partition function
	m_logz = std::log(m_root->belief.sum());

	// Compute the marginals
	for (size_t v = 0; v < m_var2clique.size(); ++v) {
		size_t ci = m_var2clique[v];
		detail::node& cl = m_clusters[ci];
		variable VX = m_gmo.var(v);

		m_beliefs[v] = marg(cl.belief, VX);
		m_beliefs[v].normalize(); // normalize
	}
}